

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O1

void __thiscall
IsoSpec::FixedEnvelope::stochastic_init<false>
          (FixedEnvelope *this,Iso *iso,size_t _no_molecules,double _precision,double _beta_bias)

{
  double *pdVar1;
  bool bVar2;
  size_t sVar3;
  byte unaff_BPL;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double local_190;
  double local_188;
  IsoStochasticGenerator local_178;
  
  IsoStochasticGenerator::IsoStochasticGenerator(&local_178,iso,_no_molecules,_precision,_beta_bias)
  ;
  this->allDim = local_178.super_IsoGenerator.super_Iso.allDim;
  this->allDimSizeofInt = local_178.super_IsoGenerator.super_Iso.allDim << 2;
  reallocate_memory<false>(this,0x400);
  do {
    if (local_178.to_sample_left == 0) {
LAB_0011d2a2:
      bVar2 = false;
      unaff_BPL = 0;
    }
    else {
      if (local_178.confs_prob < local_178.chasing_prob) {
        local_178.current_count = 1;
        local_178.to_sample_left = local_178.to_sample_left - 1;
        do {
          do {
            dVar4 = local_178.ILG.lcfmsv;
            pdVar1 = local_178.ILG.lProbs_ptr + 1;
            local_188 = local_178.ILG.lProbs_ptr[1];
            local_178.ILG.lProbs_ptr = pdVar1;
            if (local_178.ILG.lcfmsv <= local_188) goto LAB_0011d1c3;
            local_190 = local_178.ILG.lcfmsv;
            bVar2 = IsoLayeredGenerator::carry(&local_178.ILG);
          } while (bVar2);
          if (dVar4 <= local_188) goto LAB_0011d1c3;
          bVar2 = IsoLayeredGenerator::nextLayer(&local_178.ILG,-2.0);
        } while (bVar2);
LAB_0011d290:
        if (local_190 <= local_188) {
LAB_0011d1c3:
          do {
            local_178.confs_prob =
                 local_178.ILG.super_IsoGenerator.partialProbs[1] *
                 ((*local_178.ILG.marginalResults)->probs).store
                 [(int)((ulong)((long)local_178.ILG.lProbs_ptr -
                               (long)local_178.ILG.lProbs_ptr_start) >> 3)] + local_178.confs_prob;
            if (local_178.chasing_prob < local_178.confs_prob) {
              if (local_178.to_sample_left == 0) goto LAB_0011d497;
              dVar4 = local_178.confs_prob - local_178.chasing_prob;
              goto LAB_0011d2be;
            }
            while( true ) {
              dVar4 = local_178.ILG.lcfmsv;
              pdVar1 = local_178.ILG.lProbs_ptr + 1;
              local_188 = local_178.ILG.lProbs_ptr[1];
              local_178.ILG.lProbs_ptr = pdVar1;
              if (local_178.ILG.lcfmsv <= local_188) break;
              local_190 = local_178.ILG.lcfmsv;
              bVar2 = IsoLayeredGenerator::carry(&local_178.ILG);
              if (!bVar2) {
                if (dVar4 <= local_188) break;
                bVar2 = IsoLayeredGenerator::nextLayer(&local_178.ILG,-2.0);
                if (!bVar2) goto LAB_0011d290;
              }
            }
          } while( true );
        }
        goto LAB_0011d2a2;
      }
      local_178.current_count = 0;
      do {
        do {
          dVar8 = local_178.ILG.lcfmsv;
          pdVar1 = local_178.ILG.lProbs_ptr + 1;
          dVar4 = local_178.ILG.lProbs_ptr[1];
          local_178.ILG.lProbs_ptr = pdVar1;
          if (local_178.ILG.lcfmsv <= dVar4) goto LAB_0011d16d;
          bVar2 = IsoLayeredGenerator::carry(&local_178.ILG);
        } while (bVar2);
        if (dVar8 <= dVar4) goto LAB_0011d16d;
        bVar2 = IsoLayeredGenerator::nextLayer(&local_178.ILG,-2.0);
      } while (bVar2);
      if (dVar4 < dVar8) goto LAB_0011d2a2;
LAB_0011d16d:
      dVar4 = local_178.ILG.super_IsoGenerator.partialProbs[1] *
              ((*local_178.ILG.marginalResults)->probs).store
              [(int)((ulong)((long)local_178.ILG.lProbs_ptr - (long)local_178.ILG.lProbs_ptr_start)
                    >> 3)];
      local_178.confs_prob = local_178.confs_prob + dVar4;
LAB_0011d2be:
      dVar8 = local_178.precision - local_178.chasing_prob;
      auVar5._8_4_ = (int)(local_178.to_sample_left >> 0x20);
      auVar5._0_8_ = local_178.to_sample_left;
      auVar5._12_4_ = 0x45300000;
      dVar7 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_178.to_sample_left) - 4503599627370496.0);
      if ((dVar4 * dVar7) / dVar8 <= local_178.beta_bias) {
        dVar4 = std::
                generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                          ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)&random_gen);
        dVar4 = pow(dVar4 * (DAT_0012d9c8 - stdunif) + stdunif,1.0 / dVar7);
        for (dVar8 = (1.0 - dVar4) * dVar8; dVar4 = local_178.precision,
            dVar8 = dVar8 + local_178.chasing_prob, local_178.chasing_prob = dVar8,
            dVar8 <= local_178.confs_prob; dVar8 = (1.0 - dVar7) * (dVar4 - dVar8)) {
          local_178.current_count = local_178.current_count + 1;
          sVar3 = local_178.to_sample_left - 1;
          local_178.to_sample_left = sVar3;
          if (sVar3 == 0) {
            bVar2 = false;
            unaff_BPL = 1;
            goto LAB_0011d4a7;
          }
          dVar7 = std::
                  generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                              *)&random_gen);
          auVar6._8_4_ = (int)(sVar3 >> 0x20);
          auVar6._0_8_ = sVar3;
          auVar6._12_4_ = 0x45300000;
          dVar7 = pow(dVar7 * (DAT_0012d9c8 - stdunif) + stdunif,
                      1.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)));
        }
        if (local_178.current_count == 0) goto LAB_0011d49e;
LAB_0011d497:
        unaff_BPL = 1;
LAB_0011d49a:
        bVar2 = false;
      }
      else {
        sVar3 = local_178.to_sample_left;
        if (dVar4 / dVar8 < 1.0) {
          sVar3 = boost_binomial_distribution_variate
                            (local_178.to_sample_left,dVar4 / dVar8,(mt19937 *)&random_gen);
        }
        local_178.to_sample_left = local_178.to_sample_left - sVar3;
        local_178.current_count = local_178.current_count + sVar3;
        unaff_BPL = unaff_BPL | local_178.current_count != 0;
        local_178.chasing_prob = local_178.confs_prob;
        if (local_178.current_count != 0) goto LAB_0011d49a;
LAB_0011d49e:
        bVar2 = true;
      }
    }
LAB_0011d4a7:
    if (!bVar2) {
      if ((unaff_BPL & 1) == 0) {
        local_178.super_IsoGenerator.super_Iso._vptr_Iso =
             (_func_int **)&PTR__IsoStochasticGenerator_0012bbf0;
        IsoLayeredGenerator::~IsoLayeredGenerator(&local_178.ILG);
        IsoGenerator::~IsoGenerator(&local_178.super_IsoGenerator);
        return;
      }
      addConfILG<false,IsoSpec::IsoStochasticGenerator>(this,&local_178);
    }
  } while( true );
}

Assistant:

void FixedEnvelope::stochastic_init(Iso&& iso, size_t _no_molecules, double _precision, double _beta_bias)
{
    IsoStochasticGenerator generator(std::move(iso), _no_molecules, _precision, _beta_bias);

    this->allDim = generator.getAllDim();
    this->allDimSizeofInt = this->allDim * sizeof(int);

    this->reallocate_memory<tgetConfs>(ISOSPEC_INIT_TABLE_SIZE);

    while(generator.advanceToNextConfiguration())
        addConfILG<tgetConfs, IsoStochasticGenerator>(generator);
}